

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::publish
          (Publication *this,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  bool bVar1;
  long in_RDI;
  SmallBuffer db;
  bool doPublish;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_000001a0;
  DataType in_stack_000001ac;
  SmallBuffer *this_00;
  SmallBuffer *in_stack_ffffffffffffff58;
  data_view *in_stack_ffffffffffffff60;
  Publication *in_stack_ffffffffffffff68;
  ValueFederate *in_stack_ffffffffffffff70;
  defV *in_stack_ffffffffffffff78;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff80;
  undefined1 local_11;
  
  local_11 = *(long *)(in_RDI + 0x38) != 0;
  if ((*(byte *)(in_RDI + 0x5c) & 1) != 0) {
    bVar1 = changeDetected(in_stack_ffffffffffffff78,
                           (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68);
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff80,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                  in_stack_ffffffffffffff78);
    }
    local_11 = bVar1 && local_11;
  }
  if (local_11) {
    typeConvert(in_stack_000001ac,in_stack_000001a0);
    this_00 = *(SmallBuffer **)(in_RDI + 0x38);
    data_view::data_view(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    helics::ValueFederate::publishBytes
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    data_view::~data_view((data_view *)0x2c486f);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(const std::vector<std::complex<double>>& val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}